

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

void xmlXIncludeErr(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node,int error,char *msg,xmlChar *extra)

{
  xmlStructuredErrorFunc schannel;
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlGenericErrorFunc channel;
  
  if (error == 2) {
    ctxt->fatalErr = 1;
    ctxt->errNo = 2;
    ctxt->nbErrors = ctxt->nbErrors + 1;
    xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                        (xmlError *)0x0);
    return;
  }
  if (ctxt->fatalErr == 0) {
    ctxt->nbErrors = ctxt->nbErrors + 1;
    schannel = ctxt->errorHandler;
    if (schannel == (xmlStructuredErrorFunc)0x0) {
      pp_Var2 = __xmlGenericError();
      channel = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
    }
    else {
      ppvVar3 = &ctxt->errorCtxt;
      channel = (xmlGenericErrorFunc)0x0;
    }
    iVar1 = xmlRaiseError(schannel,channel,*ppvVar3,ctxt,node,0xb,error,XML_ERR_ERROR,(char *)0x0,0,
                          (char *)extra,(char *)0x0,(char *)0x0,0,0,msg,extra);
    if (iVar1 < 0) {
      ctxt->fatalErr = 1;
      ctxt->errNo = 2;
    }
    else {
      ctxt->errNo = error;
      iVar1 = xmlIsCatastrophicError(3,error);
      if (iVar1 != 0) {
        ctxt->fatalErr = 1;
      }
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlXIncludeErr(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node, int error,
               const char *msg, const xmlChar *extra)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    int res;

    if (error == XML_ERR_NO_MEMORY) {
        xmlXIncludeErrMemory(ctxt);
        return;
    }